

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_start_new_block(MD_CTX *ctx,MD_LINE_ANALYSIS *line)

{
  uint *puVar1;
  undefined4 *in_RSI;
  long in_RDI;
  MD_BLOCK *block;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  puVar1 = (uint *)md_push_block_bytes((MD_CTX *)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,(int)((ulong)in_RDI >> 0x20));
  if (puVar1 == (uint *)0x0) {
    iVar2 = -1;
  }
  else {
    switch(*in_RSI) {
    case 0:
    case 4:
    case 10:
    default:
      break;
    case 1:
      *puVar1 = *puVar1 & 0xffffff00 | 5;
      break;
    case 2:
    case 3:
      *puVar1 = *puVar1 & 0xffffff00 | 6;
      break;
    case 5:
    case 6:
      *puVar1 = *puVar1 & 0xffffff00 | 7;
      break;
    case 7:
      *puVar1 = *puVar1 & 0xffffff00 | 8;
      break;
    case 8:
      *puVar1 = *puVar1 & 0xffffff00 | 9;
    }
    *puVar1 = *puVar1 & 0xffff00ff;
    *puVar1 = *puVar1 & 0xffff | in_RSI[1] << 0x10;
    puVar1[1] = 0;
    *(uint **)(in_RDI + 0x210) = puVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
md_start_new_block(MD_CTX* ctx, const MD_LINE_ANALYSIS* line)
{
    MD_BLOCK* block;

    MD_ASSERT(ctx->current_block == NULL);

    block = (MD_BLOCK*) md_push_block_bytes(ctx, sizeof(MD_BLOCK));
    if(block == NULL)
        return -1;

    switch(line->type) {
        case MD_LINE_HR:
            block->type = MD_BLOCK_HR;
            break;

        case MD_LINE_ATXHEADER:
        case MD_LINE_SETEXTHEADER:
            block->type = MD_BLOCK_H;
            break;

        case MD_LINE_FENCEDCODE:
        case MD_LINE_INDENTEDCODE:
            block->type = MD_BLOCK_CODE;
            break;

        case MD_LINE_TEXT:
            block->type = MD_BLOCK_P;
            break;

        case MD_LINE_HTML:
            block->type = MD_BLOCK_HTML;
            break;

        case MD_LINE_BLANK:
        case MD_LINE_SETEXTUNDERLINE:
        case MD_LINE_TABLEUNDERLINE:
        default:
            MD_UNREACHABLE();
            break;
    }

    block->flags = 0;
    block->data = line->data;
    block->n_lines = 0;

    ctx->current_block = block;
    return 0;
}